

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_buffer.c
# Opt level: O2

int lj_cf_buffer_method_put(lua_State *L)

{
  lua_Number n;
  cTValue *pcVar1;
  TValue *pTVar2;
  uint64_t uVar3;
  bool bVar4;
  SBufExt *sb;
  cTValue *pcVar5;
  ulong uVar6;
  TValue *o;
  long lVar7;
  long lVar8;
  
  sb = buffer_tobuf(L);
  (sb->L).ptr64 = (ulong)((uint)(sb->L).ptr64 & 7) | (ulong)L;
  lVar7 = (long)L->top - (long)L->base;
  lVar8 = 1;
  do {
    if (lVar7 >> 3 <= lVar8) {
      L->top = L->base + 1;
      uVar3 = (L->glref).ptr64;
      if (*(ulong *)(uVar3 + 0x18) <= *(ulong *)(uVar3 + 0x10)) {
        lj_gc_step(L);
      }
      return 1;
    }
    o = L->base + lVar8;
    bVar4 = true;
    while( true ) {
      n = (lua_Number)o->u64;
      uVar6 = (long)n >> 0x2f;
      if (uVar6 == 0xfffffffffffffffb) break;
      if (uVar6 < 0xfffffffffffffff2) {
        lj_strfmt_putfnum((SBuf *)sb,0xf000035,n);
        goto LAB_0014e50b;
      }
      if ((uVar6 == 0xfffffffffffffff3) &&
         (uVar6 = (ulong)n & 0x7fffffffffff, *(char *)(uVar6 + 10) == '\x03')) {
        if ((SBufExt *)(uVar6 + 0x30) == sb) {
          lj_err_arg(L,(int)lVar8 + 1,LJ_ERR_BUFFER_SELF);
        }
        lj_buf_putmem((SBuf *)sb,*(void **)(uVar6 + 0x58),
                      *(int *)(uVar6 + 0x30) - (int)*(void **)(uVar6 + 0x58));
        goto LAB_0014e50b;
      }
      if (!bVar4) {
LAB_0014e53b:
        lj_err_argtype(L,(int)lVar8 + 1,"string/number/__tostring");
      }
      pcVar5 = lj_meta_lookup(L,o,MM_tostring);
      if (pcVar5->u64 == 0xffffffffffffffff) goto LAB_0014e53b;
      pcVar1 = L->top;
      L->top = pcVar1 + 1;
      *pcVar1 = *pcVar5;
      pTVar2 = L->top;
      L->top = pTVar2 + 1;
      pTVar2->u64 = (uint64_t)*o;
      lua_call(L,1,1);
      o = L->base + lVar8;
      *o = L->top[-1];
      L->top = (TValue *)((long)L->base + lVar7);
      bVar4 = false;
    }
    lj_buf_putstr((SBuf *)sb,(GCstr *)((ulong)n & 0x7fffffffffff));
LAB_0014e50b:
    lVar8 = lVar8 + 1;
  } while( true );
}

Assistant:

LJLIB_CF(buffer_method_put)		LJLIB_REC(.)
{
  SBufExt *sbx = buffer_tobufw(L);
  ptrdiff_t arg, narg = L->top - L->base;
  for (arg = 1; arg < narg; arg++) {
    cTValue *o = &L->base[arg], *mo = NULL;
  retry:
    if (tvisstr(o)) {
      lj_buf_putstr((SBuf *)sbx, strV(o));
    } else if (tvisint(o)) {
      lj_strfmt_putint((SBuf *)sbx, intV(o));
    } else if (tvisnum(o)) {
      lj_strfmt_putfnum((SBuf *)sbx, STRFMT_G14, numV(o));
    } else if (tvisbuf(o)) {
      SBufExt *sbx2 = bufV(o);
      if (sbx2 == sbx) lj_err_arg(L, arg+1, LJ_ERR_BUFFER_SELF);
      lj_buf_putmem((SBuf *)sbx, sbx2->r, sbufxlen(sbx2));
    } else if (!mo && !tvisnil(mo = lj_meta_lookup(L, o, MM_tostring))) {
      /* Call __tostring metamethod inline. */
      copyTV(L, L->top++, mo);
      copyTV(L, L->top++, o);
      lua_call(L, 1, 1);
      o = &L->base[arg];  /* The stack may have been reallocated. */
      copyTV(L, &L->base[arg], L->top-1);
      L->top = L->base + narg;
      goto retry;  /* Retry with the result. */
    } else {
      lj_err_argtype(L, arg+1, "string/number/__tostring");
    }
    /* Probably not useful to inline other __tostring MMs, e.g. FFI numbers. */
  }
  L->top = L->base+1;  /* Chain buffer object. */
  lj_gc_check(L);
  return 1;
}